

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.hpp
# Opt level: O0

cake_iterator<false> * __thiscall
skiplist<int,_std::less<int>_>::cake_iterator<false>::operator++(cake_iterator<false> *this)

{
  cake_iterator<false> *this_local;
  
  if (this->node_count_ == 0) {
    if ((this->reverse_ & 1U) == 0) {
      this->node = this->node->next;
    }
    else {
      this->node = this->node->back;
    }
    if (this->node != (SLNode<int> *)0x0) {
      this->node_count_ = this->node->count + -1;
      this->node_count_ref_ = this->node_count_;
    }
  }
  else {
    this->node_count_ = this->node_count_ + -1;
  }
  return this;
}

Assistant:

const cake_iterator& operator++() {
        if(node_count_ != 0) {
            --node_count_;
            return *this;
        }
        if(reverse_)
            node = node->back;
        else
            node = node->next;
        if(node) {
            node_count_ = node->count - 1;
            node_count_ref_ = node_count_;
        }
        return *this;
    }